

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O0

void do_cmd_accept_character(command_conflict *cmd)

{
  command_conflict *cmd_local;
  
  options_init_cheat();
  roll_hp();
  ignore_birth_init();
  history_clear(player);
  history_add(player,"Began the quest to destroy Morgoth.",L'\x01');
  message_add(" ",0);
  message_add("  ",0);
  message_add("====================",0);
  message_add("  ",0);
  message_add(" ",0);
  player_embody(player);
  get_money(player);
  player_spells_init(player);
  if (((player->opts).opt[0x29] & 1U) != 0) {
    player_learn_all_runes(player);
  }
  player->obj_k->to_a = 1;
  player->obj_k->to_h = 1;
  player->obj_k->to_d = 1;
  store_reset();
  chunk_list_max = 0;
  player_learn_innate(player);
  cleanup_parser(&randart_parser);
  deactivate_randart_file();
  run_parser(&artifact_parser);
  if (((player->opts).opt[0x1e] & 1U) != 0) {
    seed_randart = Rand_div(0x10000000);
    do_randart(seed_randart,true);
    deactivate_randart_file();
  }
  seed_flavor = Rand_div(0x10000000);
  flavor_init();
  if (((player->opts).opt[0x2a] & 1U) != 0) {
    flavor_set_all_aware();
  }
  player_outfit(player);
  player->is_dead = false;
  character_generated = true;
  player->upkeep->playing = true;
  cmd_disable_repeat();
  string_free(prev.history);
  prev.history = (char *)0x0;
  string_free(quickstart_prev.history);
  quickstart_prev.history = (char *)0x0;
  event_signal(EVENT_LEAVE_BIRTH);
  return;
}

Assistant:

void do_cmd_accept_character(struct command *cmd)
{
	options_init_cheat();

	roll_hp();

	ignore_birth_init();

	/* Clear old messages, add new starting message */
	history_clear(player);
	history_add(player, "Began the quest to destroy Morgoth.", HIST_PLAYER_BIRTH);

	/* Note player birth in the message recall */
	message_add(" ", MSG_GENERIC);
	message_add("  ", MSG_GENERIC);
	message_add("====================", MSG_GENERIC);
	message_add("  ", MSG_GENERIC);
	message_add(" ", MSG_GENERIC);

	/* Embody */
	player_embody(player);

	/* Give the player some money */
	get_money(player);

	/* Initialise the spells */
	player_spells_init(player);

	/* Know all runes for ID on walkover */
	if (OPT(player, birth_know_runes))
		player_learn_all_runes(player);

	/* Hack - player knows all combat runes.  Maybe make them not runes? NRM */
	player->obj_k->to_a = 1;
	player->obj_k->to_h = 1;
	player->obj_k->to_d = 1;

	/* Initialise the stores, dungeon */
	store_reset();
	chunk_list_max = 0;

	/* Player learns innate runes */
	player_learn_innate(player);

	/* Restore the standard artifacts (randarts may have been loaded) */
	cleanup_parser(&randart_parser);
	deactivate_randart_file();
	run_parser(&artifact_parser);

	/* Now only randomize the artifacts if required */
	if (OPT(player, birth_randarts)) {
		seed_randart = randint0(0x10000000);
		do_randart(seed_randart, true);
		deactivate_randart_file();
	}

	/* Seed for flavors */
	seed_flavor = randint0(0x10000000);
	flavor_init();

	/* Know all flavors for auto-ID of consumables */
	if (OPT(player, birth_know_flavors))
		flavor_set_all_aware();

	/* Outfit the player, if they can sell the stuff */
	player_outfit(player);

	/* Stop the player being quite so dead */
	player->is_dead = false;

	/* Character is now "complete" */
	character_generated = true;
	player->upkeep->playing = true;

	/* Disable repeat command, so we don't try to be born again */
	cmd_disable_repeat();

	/* No longer need the cached history. */
	string_free(prev.history);
	prev.history = NULL;
	string_free(quickstart_prev.history);
	quickstart_prev.history = NULL;

	/* Now we're really done.. */
	event_signal(EVENT_LEAVE_BIRTH);
}